

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

void vkt::SpirVAssembly::createSConvertCases
               (vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                *testCases)

{
  ConvertCase local_90;
  
  ConvertCase::ConvertCase(&local_90,INTEGER_TYPE_SIGNED_16,INTEGER_TYPE_SIGNED_32,0x394d);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&local_90);
  ConvertCase::~ConvertCase(&local_90);
  ConvertCase::ConvertCase(&local_90,INTEGER_TYPE_SIGNED_16,INTEGER_TYPE_SIGNED_64,0xd0d);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&local_90);
  ConvertCase::~ConvertCase(&local_90);
  ConvertCase::ConvertCase(&local_90,INTEGER_TYPE_SIGNED_32,INTEGER_TYPE_SIGNED_64,0x3a081d13);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&local_90);
  ConvertCase::~ConvertCase(&local_90);
  ConvertCase::ConvertCase(&local_90,INTEGER_TYPE_SIGNED_16,INTEGER_TYPE_UNSIGNED_32,0x2448);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&local_90);
  ConvertCase::~ConvertCase(&local_90);
  ConvertCase::ConvertCase(&local_90,INTEGER_TYPE_SIGNED_16,INTEGER_TYPE_UNSIGNED_64,0x3c64);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&local_90);
  ConvertCase::~ConvertCase(&local_90);
  ConvertCase::ConvertCase(&local_90,INTEGER_TYPE_SIGNED_32,INTEGER_TYPE_UNSIGNED_64,0x14a2cc55);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&local_90);
  ConvertCase::~ConvertCase(&local_90);
  return;
}

Assistant:

void createSConvertCases (vector<ConvertCase>& testCases)
{
	// Convert int to int
	testCases.push_back(ConvertCase(INTEGER_TYPE_SIGNED_16,	INTEGER_TYPE_SIGNED_32,		14669));
	testCases.push_back(ConvertCase(INTEGER_TYPE_SIGNED_16,	INTEGER_TYPE_SIGNED_64,		3341));

	testCases.push_back(ConvertCase(INTEGER_TYPE_SIGNED_32,	INTEGER_TYPE_SIGNED_64,		973610259));

	// Convert int to unsigned int
	testCases.push_back(ConvertCase(INTEGER_TYPE_SIGNED_16,	INTEGER_TYPE_UNSIGNED_32,	9288));
	testCases.push_back(ConvertCase(INTEGER_TYPE_SIGNED_16,	INTEGER_TYPE_UNSIGNED_64,	15460));

	testCases.push_back(ConvertCase(INTEGER_TYPE_SIGNED_32,	INTEGER_TYPE_UNSIGNED_64,	346213461));
}